

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall
FormatterTest_WideFormatString_Test::TestBody(FormatterTest_WideFormatString_Test *this)

{
  int *in_RCX;
  wchar_t *pwVar1;
  char *pcVar2;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_30;
  
  local_48.data_._0_4_ = 0x2a;
  fmt::v5::format<wchar_t[3],int>(&local_30,(v5 *)0x1f490c,(wchar_t (*) [3])&local_48,in_RCX);
  pwVar1 = L"42";
  testing::internal::CmpHelperEQ<wchar_t[3],std::__cxx11::wstring>
            ((internal *)&gtest_ar,"L\"42\"","format(L\"{}\", 42)",(wchar_t (*) [3])L"42",&local_30)
  ;
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pwVar1 = (wchar_t *)0x66f;
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x66f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48.data_ = (AssertHelperData *)0x4010cccccccccccd;
  fmt::v5::format<wchar_t[3],double>
            (&local_30,(v5 *)0x1f490c,(wchar_t (*) [3])&local_48,(double *)pwVar1);
  pwVar1 = L"4.2";
  testing::internal::CmpHelperEQ<wchar_t[4],std::__cxx11::wstring>
            ((internal *)&gtest_ar,"L\"4.2\"","format(L\"{}\", 4.2)",(wchar_t (*) [4])L"4.2",
             &local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pwVar1 = (wchar_t *)0x670;
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x670,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<wchar_t[3],wchar_t[4]>
            (&local_30,(v5 *)0x1f490c,(wchar_t (*) [3])L"abc",(wchar_t (*) [4])pwVar1);
  pwVar1 = L"abc";
  testing::internal::CmpHelperEQ<wchar_t[4],std::__cxx11::wstring>
            ((internal *)&gtest_ar,"L\"abc\"","format(L\"{}\", L\"abc\")",(wchar_t (*) [4])L"abc",
             &local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pwVar1 = (wchar_t *)0x671;
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x671,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48.data_._0_4_ = 0x7a;
  fmt::v5::format<wchar_t[3],wchar_t>(&local_30,(v5 *)0x1f490c,(wchar_t (*) [3])&local_48,pwVar1);
  testing::internal::CmpHelperEQ<wchar_t[2],std::__cxx11::wstring>
            ((internal *)&gtest_ar,"L\"z\"","format(L\"{}\", L\'z\')",(wchar_t (*) [2])L"z",
             &local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x672,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatterTest, WideFormatString) {
  EXPECT_EQ(L"42", format(L"{}", 42));
  EXPECT_EQ(L"4.2", format(L"{}", 4.2));
  EXPECT_EQ(L"abc", format(L"{}", L"abc"));
  EXPECT_EQ(L"z", format(L"{}", L'z'));
}